

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

optional<std::pair<helics::route_id,_helics::ActionMessage>_> * __thiscall
gmlc::containers::
BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
::try_pop(BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
          *this)

{
  bool bVar1;
  reference this_00;
  long in_RSI;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *in_RDI;
  pair<helics::route_id,_helics::ActionMessage> *__t;
  lock_guard<std::mutex> pullLock;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *val;
  pair<helics::route_id,_helics::ActionMessage> *in_stack_ffffffffffffffa8;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *in_stack_ffffffffffffffb0;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> *this_01;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffb0,
             (mutex_type *)in_stack_ffffffffffffffa8);
  bVar1 = std::
          queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
          ::empty((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                   *)0x486524);
  if (bVar1) {
    checkPullAndSwap(in_stack_ffffffffffffffe0);
    bVar1 = std::
            vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
            ::empty((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                     *)this_01);
    if (bVar1) {
      std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::optional(in_RDI);
    }
    else {
      __t = (pair<helics::route_id,_helics::ActionMessage> *)(in_RSI + 0x68);
      std::
      vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
              *)in_stack_ffffffffffffffb0);
      std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::
      optional<std::pair<helics::route_id,_helics::ActionMessage>,_true>
                (in_stack_ffffffffffffffb0,__t);
      std::
      vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
      ::pop_back((vector<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>
                  *)0x48662d);
      checkPullAndSwap(in_stack_ffffffffffffffe0);
    }
  }
  else {
    this_00 = std::
              queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
              ::front((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
                       *)0x48654e);
    std::optional<std::pair<helics::route_id,_helics::ActionMessage>_>::
    optional<std::pair<helics::route_id,_helics::ActionMessage>,_true>
              ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)this_00,
               in_stack_ffffffffffffffa8);
    std::
    queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
    ::pop((queue<std::pair<helics::route_id,_helics::ActionMessage>,_std::deque<std::pair<helics::route_id,_helics::ActionMessage>,_std::allocator<std::pair<helics::route_id,_helics::ActionMessage>_>_>_>
           *)0x486575);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x48667f);
  return this_01;
}

Assistant:

std::optional<T> BlockingPriorityQueue<T, MUTEX, COND>::try_pop()
    {
        std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
        if (!priorityQueue.empty()) {
            std::optional<T> val(std::move(priorityQueue.front()));
            priorityQueue.pop();
            return val;
        }
        checkPullAndSwap();
        if (pullElements.empty()) {
            return std::nullopt;
        }
        // do it this way to allow movable only types
        std::optional<T> val(std::move(pullElements.back()));
        pullElements.pop_back();
        checkPullAndSwap();
        return val;
    }